

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser.H
# Opt level: O0

ParserExecutor<3> __thiscall amrex::Parser::compile<3>(Parser *this)

{
  ParserExecutor<3> PVar1;
  ParserExecutor<3> exe;
  Parser *in_stack_000001a8;
  
  PVar1 = compileHost<3>(in_stack_000001a8);
  return (ParserExecutor<3>)PVar1.m_host_executor;
}

Assistant:

ParserExecutor<N>
Parser::compile () const
{
    auto exe = compileHost<N>();

#ifdef AMREX_USE_GPU
    if (m_data && m_data->m_parser && !(m_data->m_device_executor)) {
        m_data->m_device_executor = (char*)The_Arena()->alloc(m_data->m_exe_size);
        Gpu::htod_memcpy_async(m_data->m_device_executor, m_data->m_host_executor,
                               m_data->m_exe_size);
        Gpu::streamSynchronize();
        exe.m_device_executor = m_data->m_device_executor;
    }
#endif

    return exe;
}